

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CZ.hpp
# Opt level: O2

bool __thiscall qclab::qgates::CZ<float>::equals(CZ<float> *this,QObject<float> *other)

{
  long lVar1;
  int iVar2;
  int iVar3;
  long *plVar4;
  
  plVar4 = (long *)__dynamic_cast(other,&QObject<float>::typeinfo,&typeinfo,0);
  if ((plVar4 != (long *)0x0) &&
     (*(int *)((long)plVar4 + 0xc) == (this->super_QControlledGate2<float>).controlState_)) {
    lVar1 = plVar4[1];
    iVar2 = (**(code **)(*plVar4 + 0x78))(plVar4);
    if (((int)lVar1 < iVar2) &&
       (iVar2 = (this->super_QControlledGate2<float>).control_,
       iVar3 = (*(this->super_QControlledGate2<float>).super_QGate2<float>.super_QObject<float>.
                 _vptr_QObject[0xf])(this), iVar2 < iVar3)) {
      return true;
    }
    lVar1 = plVar4[1];
    iVar2 = (**(code **)(*plVar4 + 0x78))(plVar4);
    if (iVar2 < (int)lVar1) {
      iVar2 = (this->super_QControlledGate2<float>).control_;
      iVar3 = (*(this->super_QControlledGate2<float>).super_QGate2<float>.super_QObject<float>.
                _vptr_QObject[0xf])(this);
      return iVar3 < iVar2;
    }
  }
  return false;
}

Assistant:

inline bool equals( const QObject< T >& other ) const override {
          using CG = CZ< T > ;
          if ( const CG* p = dynamic_cast< const CG* >( &other ) ) {
            if ( p->controlState() != this->controlState() ) return false ;
            return ( ( p->control() < p->target() ) &&
                     ( this->control() < this->target() ) ) ||
                   ( ( p->control() > p->target() ) &&
                     ( this->control() > this->target() ) ) ;
          }
          return false ;
        }